

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitPLTerm(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
            *this,PLTerm e)

{
  int iVar1;
  uint uVar2;
  BasicWriter<char> *pBVar3;
  Buffer<char> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  FormatSpec local_48;
  
  pBVar3 = this->writer_;
  pBVar4 = pBVar3->buffer_;
  uVar8 = pBVar4->size_ + 2;
  if (pBVar4->capacity_ < uVar8) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
  }
  pcVar5 = pBVar4->ptr_;
  sVar6 = pBVar4->size_;
  (pcVar5 + sVar6)[0] = '<';
  (pcVar5 + sVar6)[1] = '<';
  pBVar4->size_ = uVar8;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>
            (pBVar3,*(double *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase
                            .impl_ + 0x18),&local_48);
  iVar1 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                         impl_ + 4);
  if (1 < (long)iVar1) {
    lVar7 = 0;
    do {
      pBVar3 = this->writer_;
      pBVar4 = pBVar3->buffer_;
      uVar8 = pBVar4->size_ + 2;
      if (pBVar4->capacity_ < uVar8) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
      }
      pcVar5 = pBVar4->ptr_;
      sVar6 = pBVar4->size_;
      (pcVar5 + sVar6)[0] = ',';
      (pcVar5 + sVar6)[1] = ' ';
      pBVar4->size_ = uVar8;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (pBVar3,*(double *)
                         ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                super_ExprBase.impl_ + 0x28 + lVar7),&local_48);
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar1 * 0x10 + -0x10 != lVar7);
  }
  pBVar3 = this->writer_;
  pBVar4 = pBVar3->buffer_;
  uVar8 = pBVar4->size_ + 2;
  if (pBVar4->capacity_ < uVar8) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
  }
  pcVar5 = pBVar4->ptr_;
  sVar6 = pBVar4->size_;
  (pcVar5 + sVar6)[0] = ';';
  (pcVar5 + sVar6)[1] = ' ';
  pBVar4->size_ = uVar8;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>
            (pBVar3,*(double *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase
                            .impl_ + 0x10),&local_48);
  uVar2 = *(uint *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_ + 4);
  if (0 < (int)uVar2) {
    lVar7 = 0;
    do {
      pBVar3 = this->writer_;
      pBVar4 = pBVar3->buffer_;
      uVar8 = pBVar4->size_ + 2;
      if (pBVar4->capacity_ < uVar8) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
      }
      pcVar5 = pBVar4->ptr_;
      sVar6 = pBVar4->size_;
      (pcVar5 + sVar6)[0] = ',';
      (pcVar5 + sVar6)[1] = ' ';
      pBVar4->size_ = uVar8;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (pBVar3,*(double *)
                         ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                super_ExprBase.impl_ + 0x20 + lVar7),&local_48);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar7);
  }
  pBVar4 = this->writer_->buffer_;
  uVar8 = pBVar4->size_ + 3;
  if (pBVar4->capacity_ < uVar8) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
  }
  pcVar5 = pBVar4->ptr_;
  sVar6 = pBVar4->size_;
  pcVar5[sVar6 + 2] = ' ';
  pcVar5 = pcVar5 + sVar6;
  pcVar5[0] = '>';
  pcVar5[1] = '>';
  pBVar4->size_ = uVar8;
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
             8))->impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitPLTerm(PLTerm e) {
  writer_ << "<<" << e.breakpoint(0);
  for (int i = 1, n = e.num_breakpoints(); i < n; ++i)
    writer_ << ", " << e.breakpoint(i);
  writer_ << "; " << e.slope(0);
  for (int i = 1, n = e.num_slopes(); i < n; ++i)
    writer_ << ", " << e.slope(i);
  writer_ << ">> ";
  Visit( e.arg() );
}